

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::~tag_t(tag_t<cfgfile::string_trait_t> *this)

{
  this->_vptr_tag_t = (_func_int **)&PTR__tag_t_001364c8;
  std::
  _Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::~_Vector_base(&(this->m_child_tags).
                   super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                 );
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~tag_t()
	{
	}